

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core_sse2.cc
# Opt level: O3

void webrtc::OverdriveAndSuppressSSE2(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  uint uVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  uint uVar17;
  undefined1 auVar12 [16];
  float fVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  auVar7 = _DAT_001a8900;
  auVar6 = _DAT_001a88f0;
  fVar19 = aec->overDriveSm;
  lVar8 = 0;
  do {
    pfVar1 = hNl + lVar8;
    fVar11 = *pfVar1;
    fVar14 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar18 = pfVar1[3];
    uVar10 = ~-(uint)(hNlFb < fVar11) & (uint)fVar11 |
             (uint)((1.0 - (float)(&WebRtcAec_weightCurve)[lVar8]) * fVar11 +
                   hNlFb * (float)(&WebRtcAec_weightCurve)[lVar8]) & -(uint)(hNlFb < fVar11);
    uVar13 = ~-(uint)(hNlFb < fVar14) & (uint)fVar14 |
             (uint)((1.0 - (float)(&DAT_001a8194)[lVar8]) * fVar14 +
                   hNlFb * (float)(&DAT_001a8194)[lVar8]) & -(uint)(hNlFb < fVar14);
    uVar15 = ~-(uint)(hNlFb < fVar16) & (uint)fVar16 |
             (uint)((1.0 - *(float *)(&UNK_001a8198 + lVar8 * 4)) * fVar16 +
                   hNlFb * *(float *)(&UNK_001a8198 + lVar8 * 4)) & -(uint)(hNlFb < fVar16);
    uVar17 = ~-(uint)(hNlFb < fVar18) & (uint)fVar18 |
             (uint)((1.0 - *(float *)(&UNK_001a819c + lVar8 * 4)) * fVar18 +
                   hNlFb * *(float *)(&UNK_001a819c + lVar8 * 4)) & -(uint)(hNlFb < fVar18);
    fVar11 = (float)(uVar10 & 0x7fffff | 0x3f800000);
    fVar14 = (float)(uVar13 & 0x7fffff | 0x3f800000);
    fVar16 = (float)(uVar15 & 0x7fffff | 0x3f800000);
    fVar18 = (float)(uVar17 & 0x7fffff | 0x3f800000);
    auVar12._0_4_ =
         ((fVar11 + -1.0) *
          (((((fVar11 * -0.034436006 + 0.31821337) * fVar11 + -1.2315303) * fVar11 + 2.5988452) *
            fVar11 + -3.324199) * fVar11 + 3.11579) +
         (float)(uVar10 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&WebRtcAec_overDriveCurve)[lVar8] * fVar19;
    auVar12._4_4_ =
         ((fVar14 + -1.0) *
          (((((fVar14 * -0.034436006 + 0.31821337) * fVar14 + -1.2315303) * fVar14 + 2.5988452) *
            fVar14 + -3.324199) * fVar14 + 3.11579) +
         (float)(uVar13 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         (float)(&DAT_001a82a4)[lVar8] * fVar19;
    auVar12._8_4_ =
         ((fVar16 + -1.0) *
          (((((fVar16 * -0.034436006 + 0.31821337) * fVar16 + -1.2315303) * fVar16 + 2.5988452) *
            fVar16 + -3.324199) * fVar16 + 3.11579) +
         (float)(uVar15 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a82a8 + lVar8 * 4) * fVar19;
    auVar12._12_4_ =
         ((fVar18 + -1.0) *
          (((((fVar18 * -0.034436006 + 0.31821337) * fVar18 + -1.2315303) * fVar18 + 2.5988452) *
            fVar18 + -3.324199) * fVar18 + 3.11579) +
         (float)(uVar17 >> 8 & 0x7f8000 | 0x43800000) + -383.0) *
         *(float *)(&UNK_001a82ac + lVar8 * 4) * fVar19;
    auVar12 = minps(auVar12,auVar6);
    auVar12 = maxps(auVar12,auVar7);
    iVar20 = (int)(auVar12._0_4_ + -0.5);
    iVar21 = (int)(auVar12._4_4_ + -0.5);
    iVar22 = (int)(auVar12._8_4_ + -0.5);
    iVar23 = (int)(auVar12._12_4_ + -0.5);
    fVar11 = auVar12._0_4_ - (float)iVar20;
    fVar14 = auVar12._4_4_ - (float)iVar21;
    fVar16 = auVar12._8_4_ - (float)iVar22;
    fVar18 = auVar12._12_4_ - (float)iVar23;
    fVar24 = ((fVar11 * 0.33718944 + 0.6576363) * fVar11 + 1.0017247) *
             (float)(iVar20 * 0x800000 + 0x3f800000);
    fVar25 = ((fVar14 * 0.33718944 + 0.6576363) * fVar14 + 1.0017247) *
             (float)(iVar21 * 0x800000 + 0x3f800000);
    fVar26 = ((fVar16 * 0.33718944 + 0.6576363) * fVar16 + 1.0017247) *
             (float)(iVar22 * 0x800000 + 0x3f800000);
    fVar27 = ((fVar18 * 0.33718944 + 0.6576363) * fVar18 + 1.0017247) *
             (float)(iVar23 * 0x800000 + 0x3f800000);
    pfVar1 = hNl + lVar8;
    *pfVar1 = fVar24;
    pfVar1[1] = fVar25;
    pfVar1[2] = fVar26;
    pfVar1[3] = fVar27;
    pfVar1 = *efw + lVar8;
    fVar11 = pfVar1[1];
    fVar14 = pfVar1[2];
    fVar16 = pfVar1[3];
    pfVar2 = efw[1] + lVar8;
    fVar18 = *pfVar2;
    fVar3 = pfVar2[1];
    fVar4 = pfVar2[2];
    fVar5 = pfVar2[3];
    pfVar2 = *efw + lVar8;
    *pfVar2 = *pfVar1 * fVar24;
    pfVar2[1] = fVar11 * fVar25;
    pfVar2[2] = fVar14 * fVar26;
    pfVar2[3] = fVar16 * fVar27;
    pfVar1 = efw[1] + lVar8;
    *pfVar1 = -fVar18 * fVar24;
    pfVar1[1] = -fVar3 * fVar25;
    pfVar1[2] = -fVar4 * fVar26;
    pfVar1[3] = -fVar5 * fVar27;
    uVar9 = lVar8 + 7;
    lVar8 = lVar8 + 4;
  } while (uVar9 < 0x41);
  fVar19 = hNl[0x40];
  if (hNlFb < fVar19) {
    fVar19 = fVar19 * 0.6 + hNlFb * 0.4;
    hNl[0x40] = fVar19;
  }
  fVar19 = powf(fVar19,aec->overDriveSm * 2.0);
  hNl[0x40] = fVar19;
  (*efw)[0x40] = fVar19 * (*efw)[0x40];
  efw[1][0x40] = -efw[1][0x40] * hNl[0x40];
  return;
}

Assistant:

static void OverdriveAndSuppressSSE2(AecCore* aec,
                                     float hNl[PART_LEN1],
                                     const float hNlFb,
                                     float efw[2][PART_LEN1]) {
  int i;
  const __m128 vec_hNlFb = _mm_set1_ps(hNlFb);
  const __m128 vec_one = _mm_set1_ps(1.0f);
  const __m128 vec_minus_one = _mm_set1_ps(-1.0f);
  const __m128 vec_overDriveSm = _mm_set1_ps(aec->overDriveSm);
  // vectorized code (four at once)
  for (i = 0; i + 3 < PART_LEN1; i += 4) {
    // Weight subbands
    __m128 vec_hNl = _mm_loadu_ps(&hNl[i]);
    const __m128 vec_weightCurve = _mm_loadu_ps(&WebRtcAec_weightCurve[i]);
    const __m128 bigger = _mm_cmpgt_ps(vec_hNl, vec_hNlFb);
    const __m128 vec_weightCurve_hNlFb = _mm_mul_ps(vec_weightCurve, vec_hNlFb);
    const __m128 vec_one_weightCurve = _mm_sub_ps(vec_one, vec_weightCurve);
    const __m128 vec_one_weightCurve_hNl =
        _mm_mul_ps(vec_one_weightCurve, vec_hNl);
    const __m128 vec_if0 = _mm_andnot_ps(bigger, vec_hNl);
    const __m128 vec_if1 = _mm_and_ps(
        bigger, _mm_add_ps(vec_weightCurve_hNlFb, vec_one_weightCurve_hNl));
    vec_hNl = _mm_or_ps(vec_if0, vec_if1);

    {
      const __m128 vec_overDriveCurve =
          _mm_loadu_ps(&WebRtcAec_overDriveCurve[i]);
      const __m128 vec_overDriveSm_overDriveCurve =
          _mm_mul_ps(vec_overDriveSm, vec_overDriveCurve);
      vec_hNl = mm_pow_ps(vec_hNl, vec_overDriveSm_overDriveCurve);
      _mm_storeu_ps(&hNl[i], vec_hNl);
    }

    // Suppress error signal
    {
      __m128 vec_efw_re = _mm_loadu_ps(&efw[0][i]);
      __m128 vec_efw_im = _mm_loadu_ps(&efw[1][i]);
      vec_efw_re = _mm_mul_ps(vec_efw_re, vec_hNl);
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_hNl);

      // Ooura fft returns incorrect sign on imaginary component. It matters
      // here because we are making an additive change with comfort noise.
      vec_efw_im = _mm_mul_ps(vec_efw_im, vec_minus_one);
      _mm_storeu_ps(&efw[0][i], vec_efw_re);
      _mm_storeu_ps(&efw[1][i], vec_efw_im);
    }
  }
  // scalar code for the remaining items.
  for (; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters
    // here because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}